

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShrS
          (I64ToI32Lowering *this,Index highBits,Index leftHigh,Index shift)

{
  Builder *this_00;
  Builder *pBVar1;
  Expression *pEVar2;
  Const *pCVar3;
  Binary *pBVar4;
  LocalSet *any;
  Expression *pEVar5;
  Block *pBVar6;
  
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar2 = (Expression *)MixedArena::allocSpace(&this_00->wasm->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  pEVar2[1]._id = leftHigh;
  (pEVar2->type).id = 2;
  pCVar3 = Builder::makeConst<int>
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
  pBVar4 = (Binary *)MixedArena::allocSpace(&this_00->wasm->allocator,0x28,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar4->op = ShrSInt32;
  pBVar4->left = pEVar2;
  pBVar4->right = (Expression *)pCVar3;
  Binary::finalize(pBVar4);
  any = Builder::makeLocalSet(this_00,highBits,(Expression *)pBVar4);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar2 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  pEVar2[1]._id = leftHigh;
  (pEVar2->type).id = 2;
  pEVar5 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar5->_id = LocalGetId;
  pEVar5[1]._id = shift;
  (pEVar5->type).id = 2;
  pBVar4 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar4->op = ShrSInt32;
  pBVar4->left = pEVar2;
  pBVar4->right = pEVar5;
  Binary::finalize(pBVar4);
  pBVar6 = Builder::blockify(this_00,(Expression *)any,(Expression *)pBVar4);
  return pBVar6;
}

Assistant:

Block* makeLargeShrS(Index highBits, Index leftHigh, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeConst(int32_t(31)))),
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }